

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int bytes_compar(uint8_t *a,size_t alen,uint8_t *b,size_t blen)

{
  int rv;
  size_t blen_local;
  uint8_t *b_local;
  size_t alen_local;
  uint8_t *a_local;
  
  if (alen == blen) {
    a_local._4_4_ = memcmp(a,b,alen);
  }
  else if (alen < blen) {
    a_local._4_4_ = memcmp(a,b,alen);
    if (a_local._4_4_ == 0) {
      a_local._4_4_ = -1;
    }
  }
  else {
    a_local._4_4_ = memcmp(a,b,blen);
    if (a_local._4_4_ == 0) {
      a_local._4_4_ = 1;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int bytes_compar(const uint8_t *a, size_t alen, const uint8_t *b,
                        size_t blen) {
  int rv;

  if (alen == blen) {
    return memcmp(a, b, alen);
  }

  if (alen < blen) {
    rv = memcmp(a, b, alen);

    if (rv == 0) {
      return -1;
    }

    return rv;
  }

  rv = memcmp(a, b, blen);

  if (rv == 0) {
    return 1;
  }

  return rv;
}